

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

float3 tinyusdz::geometric_normal(float3 *p0,float3 *p1,float3 *p2)

{
  float3 fVar1;
  float local_90 [2];
  float local_88;
  float local_80 [2];
  float local_78;
  float3 local_70;
  _Type local_60;
  float3 local_50;
  undefined1 local_40 [8];
  float3 n;
  float3 *p2_local;
  float3 *p1_local;
  float3 *p0_local;
  
  unique0x10000090 = p2;
  fVar1 = operator-(p1,p0);
  local_60[2] = fVar1._M_elems[2];
  local_50._M_elems[2] = local_60[2];
  local_60._0_8_ = fVar1._M_elems._0_8_;
  local_50._M_elems[0] = local_60[0];
  local_50._M_elems[1] = local_60[1];
  local_60 = fVar1._M_elems;
  fVar1 = operator-(stack0xffffffffffffffd0,p0);
  local_78 = fVar1._M_elems[2];
  local_70._M_elems[2] = local_78;
  local_80 = fVar1._M_elems._0_8_;
  local_70._M_elems[0] = local_80[0];
  local_70._M_elems[1] = local_80[1];
  fVar1 = vcross(&local_50,&local_70);
  local_88 = fVar1._M_elems[2];
  n._M_elems[0] = local_88;
  local_90 = fVar1._M_elems._0_8_;
  local_40._0_4_ = local_90[0];
  local_40._4_4_ = local_90[1];
  fVar1 = vnormalize((float3 *)local_40,1.1920929e-07);
  return (float3)fVar1._M_elems;
}

Assistant:

value::float3 geometric_normal(const value::float3 &p0, const value::float3 &p1, const value::float3 &p2)
{
  value::float3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}